

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifier.cpp
# Opt level: O1

bool __thiscall
vkt::texture::SampleVerifier::verifySampleImpl
          (SampleVerifier *this,SampleArguments *args,Vec4 *result,ostream *report)

{
  float fVar1;
  ImgDim IVar2;
  LookupLodMode LVar3;
  ImageViewParameters *pIVar4;
  SampleLookupSettings *pSVar5;
  bool bVar6;
  uint uVar7;
  float *pfVar8;
  long lVar9;
  uint faceNdx;
  bool bVar10;
  Vec4 coord;
  Vec4 dPdx;
  Vec2 dPdyFace;
  Vec2 dPdxFace;
  Vec2 coordFace;
  Vec4 dPdy;
  Vec3 drdy;
  Vec3 drdx;
  Vec3 r;
  int in_stack_ffffffffffffff08;
  Vec2 *dPdyFace_00;
  Vec4 local_e8;
  Vec4 local_d8;
  ostream *local_c0;
  Vec4 *local_b8;
  Vec2 local_b0;
  Vec2 local_a8;
  Vec2 local_a0;
  Vec4 local_98;
  float local_84 [2];
  float local_7c [2];
  float local_74 [2];
  float local_6c [2];
  float local_64 [2];
  float local_5c [2];
  Vec3 local_54;
  Vec3 local_48;
  Vec3 local_3c;
  
  local_e8.m_data._0_8_ = *(undefined8 *)(args->coord).m_data;
  local_e8.m_data._8_8_ = *(undefined8 *)((args->coord).m_data + 2);
  pIVar4 = this->m_imParams;
  IVar2 = pIVar4->dim;
  if (IVar2 - IMG_DIM_3D < 2) {
    pfVar8 = local_e8.m_data + 3;
  }
  else if (IVar2 == IMG_DIM_1D) {
    pfVar8 = local_e8.m_data + 1;
  }
  else if (IVar2 == IMG_DIM_2D) {
    pfVar8 = local_e8.m_data + 2;
  }
  else {
    pfVar8 = local_e8.m_data;
  }
  pSVar5 = this->m_sampleLookupSettings;
  if (pSVar5->isProjective == true) {
    fVar1 = *pfVar8;
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
    lVar9 = 0;
    do {
      local_d8.m_data[lVar9] = local_e8.m_data[lVar9] / fVar1;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 4);
    local_e8.m_data[0] = local_d8.m_data[0];
    local_e8.m_data[1] = local_d8.m_data[1];
    local_e8.m_data[2] = local_d8.m_data[2];
    local_e8.m_data[3] = local_d8.m_data[3];
  }
  LVar3 = pSVar5->lookupLodMode;
  if (LVar3 == LOOKUP_LOD_MODE_DERIVATIVES) {
    local_d8.m_data[0] = (args->dPdx).m_data[0];
    local_d8.m_data[1] = (args->dPdx).m_data[1];
    local_48.m_data[2] = (args->dPdx).m_data[2];
    local_d8.m_data[3] = (args->dPdx).m_data[3];
  }
  else {
    local_d8.m_data[0] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_48.m_data[2] = 0.0;
    local_d8.m_data[3] = 0.0;
  }
  local_d8.m_data[2] = local_48.m_data[2];
  if (LVar3 == LOOKUP_LOD_MODE_DERIVATIVES) {
    local_98.m_data[0] = (args->dPdy).m_data[0];
    local_98.m_data[1] = (args->dPdy).m_data[1];
    local_98.m_data[2] = (args->dPdy).m_data[2];
    local_98.m_data[3] = (args->dPdy).m_data[3];
  }
  else {
    local_98.m_data[0] = 0.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 0.0;
  }
  local_c0 = report;
  local_b8 = result;
  if (pIVar4->dim == IMG_DIM_CUBE) {
    local_3c.m_data[0] = local_e8.m_data[0];
    local_3c.m_data[1] = local_e8.m_data[1];
    local_3c.m_data[2] = local_e8.m_data[2];
    local_48.m_data[0] = local_d8.m_data[0];
    local_48.m_data[1] = local_d8.m_data[1];
    local_54.m_data[1] = local_98.m_data[1];
    local_54.m_data[0] = local_98.m_data[0];
    local_54.m_data[2] = local_98.m_data[2];
    uVar7 = util::calcCandidateCubemapFaces(&local_3c);
    bVar10 = true;
    faceNdx = 0;
    do {
      if ((uVar7 >> (faceNdx & 0x1f) & 1) == 0) {
        bVar6 = false;
      }
      else {
        local_a0.m_data[0] = 0.0;
        local_a0.m_data[1] = 0.0;
        local_a8.m_data[0] = 0.0;
        local_a8.m_data[1] = 0.0;
        local_b0.m_data[0] = 0.0;
        local_b0.m_data[1] = 0.0;
        dPdyFace_00 = &local_b0;
        util::calcCubemapFaceCoords
                  (&local_3c,&local_48,&local_54,faceNdx,&local_a0,&local_a8,dPdyFace_00);
        local_64[0] = local_a0.m_data[0];
        local_64[1] = local_a0.m_data[1];
        local_5c[0] = 0.0;
        local_5c[1] = 0.0;
        local_74[0] = local_a8.m_data[0];
        local_74[1] = local_a8.m_data[1];
        local_6c[0] = 0.0;
        local_6c[1] = 0.0;
        local_84[0] = local_b0.m_data[0];
        local_84[1] = local_b0.m_data[1];
        local_7c[0] = 0.0;
        local_7c[1] = 0.0;
        bVar6 = verifySampleCubemapFace
                          (this,args,local_b8,(Vec4 *)local_64,(Vec4 *)local_74,(Vec4 *)local_84,
                           (int)dPdyFace_00,local_c0);
      }
      if (bVar6 != false) {
        return bVar10;
      }
      bVar10 = faceNdx < 5;
      faceNdx = faceNdx + 1;
    } while (faceNdx != 6);
  }
  else {
    bVar10 = verifySampleCubemapFace
                       (this,args,result,&local_e8,&local_d8,&local_98,in_stack_ffffffffffffff08,
                        report);
  }
  return bVar10;
}

Assistant:

bool SampleVerifier::verifySampleImpl (const SampleArguments&	args,
									   const Vec4&				result,
									   std::ostream&			report) const
{
	// \todo [2016-07-11 collinbaker] Handle depth and stencil formats
	// \todo [2016-07-06 collinbaker] Handle dRef
	DE_ASSERT(m_samplerParams.isCompare == false);

	Vec4	coord	  = args.coord;
	int coordSize = 0;

	if (m_imParams.dim == IMG_DIM_1D)
	{
		coordSize = 1;
	}
	else if (m_imParams.dim == IMG_DIM_2D)
	{
		coordSize = 2;
	}
	else if (m_imParams.dim == IMG_DIM_3D || m_imParams.dim == IMG_DIM_CUBE)
	{
		coordSize = 3;
	}

	// 15.6.1 Project operation

	if (m_sampleLookupSettings.isProjective)
	{
		DE_ASSERT(args.coord[coordSize] != 0.0f);
		const float proj = coord[coordSize];

		coord = coord / proj;
	}

	const Vec4 dPdx = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdx : Vec4(0);
	const Vec4 dPdy = (m_sampleLookupSettings.lookupLodMode == LOOKUP_LOD_MODE_DERIVATIVES) ? args.dPdy : Vec4(0);

	// 15.6.3 Cube Map Face Selection and Transformations

	if (m_imParams.dim == IMG_DIM_CUBE)
	{
		const Vec3	r		   = coord.swizzle(0, 1, 2);
		const Vec3	drdx	   = dPdx.swizzle(0, 1, 2);
		const Vec3	drdy	   = dPdy.swizzle(0, 1, 2);

	    int			faceBitmap = calcCandidateCubemapFaces(r);

		// We must test every possible disambiguation order

		for (int faceNdx = 0; faceNdx < 6; ++faceNdx)
		{
			const bool isPossible = ((faceBitmap & (1U << faceNdx)) != 0);

		    if (!isPossible)
			{
				continue;
			}

			Vec2 coordFace;
			Vec2 dPdxFace;
			Vec2 dPdyFace;

			calcCubemapFaceCoords(r, drdx, drdy, faceNdx, coordFace, dPdxFace, dPdyFace);

			if (verifySampleCubemapFace(args,
										result,
										Vec4(coordFace[0], coordFace[1], 0.0f, 0.0f),
										Vec4(dPdxFace[0], dPdxFace[1], 0.0f, 0.0f),
										Vec4(dPdyFace[0], dPdyFace[1], 0.0f, 0.0f),
										faceNdx,
										report))
			{
				return true;
			}
		}

		return false;
	}
	else
	{
		return verifySampleCubemapFace(args, result, coord, dPdx, dPdy, 0, report);
	}
}